

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O0

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetFullName_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  string_view local_28;
  FrameworkDescriptor *local_18;
  FrameworkDescriptor *this_local;
  
  local_18 = this;
  this_local = (FrameworkDescriptor *)__return_storage_ptr__;
  local_28 = (string_view)::cm::operator____s(".framework/",0xb);
  cmStrCat<std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,std::__cxx11::string_const&>
            (__return_storage_ptr__,&this->Name,(static_string_view *)&local_28,&this->Name,
             &this->Suffix);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullName() const
    {
      return cmStrCat(this->Name, ".framework/"_s, this->Name, this->Suffix);
    }